

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O2

exr_result_t
exr_attr_set_float_vector(exr_context_t ctxt,int part_index,char *name,int32_t sz,float *val)

{
  pthread_mutex_t *__mutex;
  exr_attr_float_vector_t *fv;
  exr_result_t eVar1;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  exr_result_t eStackY_60;
  exr_attribute_t *attr;
  size_t local_40;
  exr_attribute_list_t *local_38;
  
  attr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar1;
  }
  if (ctxt->mode == '\x03') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_60 = 0x15;
LAB_0011ace4:
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,eStackY_60);
    return eVar1;
  }
  if (ctxt->mode == '\0') {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    UNRECOVERED_JUMPTABLE = ctxt->standard_error;
    eStackY_60 = 8;
    goto LAB_0011ace4;
  }
  local_40 = (long)sz * 4;
  if (0x7fffffff < local_40 || sz < 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,3,"Invalid size (%d) for float vector \'%s\'",(ulong)(uint)sz,name,
                       ctxt->print_error);
    return eVar1;
  }
  if (val == (float *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    eVar1 = (*ctxt->print_error)
                      (ctxt,3,"No input values for setting \'%s\', type \'floatvector\'",name,
                       ctxt->print_error);
    return eVar1;
  }
  local_38 = &ctxt->parts[(uint)part_index]->attributes;
  eVar1 = exr_attr_list_find_by_name(ctxt,local_38,name,&attr);
  if (eVar1 == 0) {
    if (attr->type != EXR_ATTR_FLOAT_VECTOR) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'floatvector\', but attribute is type \'%s\'",name,
                         attr->type_name);
      return eVar1;
    }
    fv = (attr->field_6).floatvector;
    if ((fv->length == sz) && (0 < fv->alloc_size)) {
      memcpy(fv->arr,val,local_40);
      eVar1 = 0;
      goto LAB_0011ae85;
    }
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar1 = (*ctxt->print_error)
                        (ctxt,0x14,
                         "Existing float vector \'%s\' has %d, requested %d, unable to change",name,
                         (ulong)((attr->field_6).preview)->width,(ulong)(uint)sz);
      return eVar1;
    }
    exr_attr_float_vector_destroy(ctxt,fv);
  }
  else {
    if (eVar1 != 0xf) goto LAB_0011ae85;
    if ((ctxt->mode != '\x01') && (ctxt->mode != '\x04')) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return 0xf;
    }
    eVar1 = exr_attr_list_add(ctxt,local_38,name,EXR_ATTR_FLOAT_VECTOR,0,(uint8_t **)0x0,&attr);
    if (eVar1 != 0) goto LAB_0011ae85;
  }
  eVar1 = exr_attr_float_vector_create(ctxt,(attr->field_6).floatvector,val,sz);
LAB_0011ae85:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_float_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       sz,
    const float*  val)
{
    exr_attribute_t* attr  = NULL;
    exr_result_t     rv    = EXR_ERR_SUCCESS;
    size_t           bytes = (size_t) sz * sizeof (float);

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (sz < 0 || bytes > (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for float vector '%s'",
            sz,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'floatvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
            return EXR_UNLOCK_AND_RETURN (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_FLOAT_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_FLOAT_VECTOR)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'floatvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->floatvector->length == sz &&
            attr->floatvector->alloc_size > 0)
        {
            memcpy (EXR_CONST_CAST (void*, attr->floatvector->arr), val, bytes);
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing float vector '%s' has %d, requested %d, unable to change",
                name,
                attr->floatvector->length,
                sz));
        }
        else
        {
            exr_attr_float_vector_destroy (ctxt, attr->floatvector);
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
        }
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}